

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O3

void __thiscall
ncnn::Yolov3DetectionOutput::qsort_descent_inplace
          (Yolov3DetectionOutput *this,
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          *datas,int left,int right)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  pointer pBVar15;
  pointer pBVar16;
  int iVar17;
  pointer pBVar18;
  int right_00;
  int iVar19;
  long lVar20;
  pointer pBVar21;
  pointer pBVar22;
  long lVar23;
  undefined4 local_3c;
  undefined4 uStack_38;
  
  pBVar18 = (datas->
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            )._M_impl.super__Vector_impl_data._M_start;
  do {
    right_00 = right;
    iVar19 = left;
    if (left <= right) {
      fVar1 = pBVar18[(left + right) / 2].score;
      do {
        lVar20 = (long)iVar19 + -1;
        pBVar15 = pBVar18 + (long)iVar19 + -1;
        iVar17 = iVar19;
        do {
          iVar19 = iVar17;
          pBVar21 = pBVar15;
          lVar20 = lVar20 + 1;
          pBVar15 = pBVar21 + 1;
          iVar17 = iVar19 + 1;
        } while (fVar1 < pBVar21[1].score);
        lVar23 = (long)right_00 + 1;
        pBVar16 = pBVar18 + (long)right_00 + 1;
        iVar17 = right_00;
        do {
          right_00 = iVar17;
          pBVar22 = pBVar16;
          lVar23 = lVar23 + -1;
          pBVar16 = pBVar22 + -1;
          iVar17 = right_00 + -1;
        } while (pBVar22[-1].score <= fVar1 && fVar1 != pBVar22[-1].score);
        if (lVar20 <= lVar23) {
          fVar13 = pBVar15->score;
          fVar14 = pBVar15->xmin;
          uVar2 = pBVar21[1].ymin;
          uVar3 = pBVar21[1].xmax;
          uVar4 = pBVar21[1].ymax;
          fVar11 = pBVar21[1].area;
          iVar12 = pBVar21[1].label;
          fVar7 = pBVar16->score;
          fVar8 = pBVar16->xmin;
          fVar9 = pBVar22[-1].ymin;
          fVar10 = pBVar22[-1].xmax;
          fVar5 = pBVar22[-1].ymax;
          fVar6 = pBVar22[-1].area;
          iVar17 = pBVar22[-1].label;
          pBVar21[1].xmax = pBVar22[-1].xmax;
          pBVar21[1].ymax = fVar5;
          pBVar21[1].area = fVar6;
          pBVar21[1].label = iVar17;
          pBVar15->score = fVar7;
          pBVar15->xmin = fVar8;
          pBVar21[1].ymin = fVar9;
          pBVar21[1].xmax = fVar10;
          pBVar22[-1].xmax = (float)uVar3;
          pBVar22[-1].ymax = (float)uVar4;
          pBVar22[-1].area = fVar11;
          pBVar22[-1].label = iVar12;
          pBVar16->score = fVar13;
          pBVar16->xmin = fVar14;
          pBVar22[-1].ymin = (float)uVar2;
          pBVar22[-1].xmax = (float)uVar3;
          pBVar18 = (datas->
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          right_00 = right_00 + -1;
          iVar19 = iVar19 + 1;
        }
      } while (iVar19 <= right_00);
    }
    if (left < right_00) {
      qsort_descent_inplace(this,datas,left,right_00);
      pBVar18 = (datas->
                super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    left = iVar19;
  } while (iVar19 < right);
  return;
}

Assistant:

void Yolov3DetectionOutput::qsort_descent_inplace(std::vector<BBoxRect>& datas, int left, int right) const
{
    int i = left;
    int j = right;
    float p = datas[(left + right) / 2].score;

    while (i <= j)
    {
        while (datas[i].score > p)
            i++;

        while (datas[j].score < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(datas[i], datas[j]);

            i++;
            j--;
        }
    }

    if (left < j)
        qsort_descent_inplace(datas, left, j);

    if (i < right)
        qsort_descent_inplace(datas, i, right);
}